

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<unsigned_int&,unsigned_int_const*,unsigned_int,bool>
          (ObjectPool<spirv_cross::SPIRConstant> *this,uint *p,uint **p_1,uint *p_2,bool *p_3)

{
  uint uVar1;
  SPIRConstant *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRConstant **ppSVar4;
  TypeID local_64;
  SPIRConstant *local_60;
  SPIRConstant *ptr;
  uint local_4c;
  SPIRConstant *pSStack_48;
  uint i;
  SPIRConstant *ptr_1;
  bool *pbStack_38;
  uint num_objects;
  bool *p_local_3;
  uint *p_local_2;
  uint **p_local_1;
  uint *p_local;
  ObjectPool<spirv_cross::SPIRConstant> *this_local;
  
  pbStack_38 = p_3;
  p_local_3 = (bool *)p_2;
  p_local_2 = (uint *)p_1;
  p_local_1 = (uint **)p;
  p_local = (uint *)this;
  bVar2 = VectorView<spirv_cross::SPIRConstant_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_48 = (SPIRConstant *)malloc((ulong)ptr_1._4_4_ * 0x168);
    if (pSStack_48 == (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve(&this->vacants,(ulong)ptr_1._4_4_);
    for (local_4c = 0; local_4c < ptr_1._4_4_; local_4c = local_4c + 1) {
      ptr = pSStack_48 + local_4c;
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRConstant*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffb8);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRConstant_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>);
  local_60 = *ppSVar4;
  SmallVector<spirv_cross::SPIRConstant_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_60;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_64,*(uint32_t *)p_local_1);
  SPIRConstant::SPIRConstant
            (this_00,local_64,*(uint32_t **)p_local_2,*(uint32_t *)p_local_3,(bool)(*pbStack_38 & 1)
            );
  return local_60;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}